

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_LegacyClosedEnum_Test::
~CppGeneratorTest_LegacyClosedEnum_Test(CppGeneratorTest_LegacyClosedEnum_Test *this)

{
  CppGeneratorTest_LegacyClosedEnum_Test *this_local;
  
  ~CppGeneratorTest_LegacyClosedEnum_Test(this);
  operator_delete(this,0x2d0);
  return;
}

Assistant:

TEST_F(CppGeneratorTest, LegacyClosedEnum) {
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    import "google/protobuf/cpp_features.proto";

    enum TestEnum {
      TEST_ENUM_UNKNOWN = 0;
    }
    message Foo {
      TestEnum bar = 1 [features.(pb.cpp).legacy_closed_enum = true];
    })schema");

  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir foo.proto");

  ExpectWarningSubstring(
      "foo.proto:9:16: warning: Feature pb.CppFeatures.legacy_closed_enum has "
      "been deprecated in edition 2023");
}